

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car.cpp
# Opt level: O2

void __thiscall Car::move(Car *this)

{
  bool bVar1;
  int iVar2;
  long in_RAX;
  int iVar3;
  int iVar4;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  
  local_28.__r = in_RAX;
  while (this->_active == true) {
    local_28.__r = (rep)this->_delay;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_28);
    bVar1 = std::operator==(&this->_axis,"horizontal");
    if (bVar1) {
      iVar2 = get_xpos(this);
      iVar2 = iVar2 + this->_speed;
      iVar3 = iVar2;
      if (iVar2 < 1) {
        iVar3 = 0;
      }
      iVar4 = this->_limit + -5;
      if (iVar2 <= this->_limit) {
        iVar4 = iVar3;
      }
      set_xpos(this,iVar4);
    }
    else {
      iVar2 = get_ypos(this);
      iVar2 = iVar2 + this->_speed;
      iVar3 = iVar2;
      if (iVar2 < 1) {
        iVar3 = 0;
      }
      iVar4 = this->_limit + -5;
      if (iVar2 <= this->_limit) {
        iVar4 = iVar3;
      }
      set_ypos(this,iVar4);
    }
    iVar3 = get_xpos(this);
    if (iVar3 < 0xf) {
      iVar3 = get_ypos(this);
      if (iVar3 < 0xf) {
        this->_active = false;
        this->_succeeded = true;
      }
    }
  }
  iVar3 = get_xpos(this);
  if (iVar3 < 0xf) {
    iVar3 = get_ypos(this);
    if (iVar3 < 0xf) {
      this->_succeeded = true;
    }
  }
  return;
}

Assistant:

void Car::move(){
        // horizontal
        // vertical
        while(_active){
            std::this_thread::sleep_for(std::chrono::milliseconds(_delay));
            if (_axis == "horizontal"){
                int x = get_xpos();
                set_xpos( newPos(x));

                //std::cout << "Car Thread #: " <<std::this_thread::get_id()<<" ---    Pos ="<< _xpos<<std::endl;
            }else{
                int y = get_ypos();
                set_ypos(newPos(y));

                //std::cout << "Car Thread #: " <<std::this_thread::get_id()<<" ---   Pos = " <<_ypos<<std::endl;
            }
            // reached to  the correct place
            if(get_xpos()< 15 && get_ypos() <15)
                {   
                    _active = false;
                    _succeeded = true;
                }
        }
            // stopped in the correct place
              if(get_xpos()< 15 && get_ypos() <15)
                {
                    _succeeded = true;
                }

                //std::cout  << std::this_thread::get_id()<< " thread is ending\n"<< std::endl;
    }